

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

uchar * tjLoadImage(char *filename,int *width,int align,int *height,int *pixelFormat,int flags)

{
  int iVar1;
  int iVar2;
  JDIMENSION JVar3;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  long lVar7;
  JDIMENSION *in_RCX;
  uint in_EDX;
  JDIMENSION *in_RSI;
  char *in_RDI;
  int *in_R8;
  uint in_R9D;
  bool bVar8;
  int row;
  uchar *dstptr;
  int nlines;
  int i;
  boolean invert;
  FILE *file;
  uchar *dstBuf;
  cjpeg_source_ptr src;
  j_compress_ptr cinfo;
  tjinstance *this;
  tjhandle handle;
  size_t pitch;
  int tempc;
  int retval;
  undefined8 in_stack_ffffffffffffff58;
  j_compress_ptr in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  uchar *local_90;
  int local_80;
  FILE *local_78;
  uchar *local_70;
  cjpeg_source_ptr local_68;
  j_compress_ptr local_50;
  int local_38;
  
  local_38 = 0;
  local_50 = (j_compress_ptr)0x0;
  local_70 = (uchar *)0x0;
  local_78 = (FILE *)0x0;
  if (((((in_RDI == (char *)0x0) || (in_RSI == (JDIMENSION *)0x0)) || ((int)in_EDX < 1)) ||
      ((in_RCX == (JDIMENSION *)0x0 || (in_R8 == (int *)0x0)))) || ((*in_R8 < -1 || (0xb < *in_R8)))
     ) {
    pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(pcVar4,200,"%s","tjLoadImage(): Invalid argument");
    local_38 = -1;
  }
  else if ((in_EDX & in_EDX - 1) == 0) {
    local_50 = (j_compress_ptr)tjInitCompress();
    if (local_50 == (j_compress_ptr)0x0) {
      return (uchar *)0x0;
    }
    local_78 = fopen(in_RDI,"rb");
    if (local_78 == (FILE *)0x0) {
      pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      snprintf(pcVar4,200,"%s\n%s","tjLoadImage(): Cannot open input file",pcVar6);
      local_38 = -1;
    }
    else {
      iVar1 = getc(local_78);
      if ((iVar1 < 0) || (iVar2 = ungetc(iVar1,local_78), iVar2 == -1)) {
        pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        snprintf(pcVar4,200,"%s\n%s","tjLoadImage(): Could not read input file",pcVar6);
        local_38 = -1;
      }
      else if (iVar1 == -1) {
        pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
        snprintf(pcVar4,200,"%s","tjLoadImage(): Input file contains no data");
        local_38 = -1;
      }
      else {
        iVar2 = _setjmp((__jmp_buf_tag *)&local_50[2].restart_interval);
        if (iVar2 == 0) {
          if (*in_R8 == -1) {
            local_50->in_color_space = JCS_UNKNOWN;
          }
          else {
            local_50->in_color_space = pf2cs[*in_R8];
          }
          if (iVar1 == 0x42) {
            local_68 = jinit_read_bmp(in_stack_ffffffffffffff60,
                                      (boolean)((ulong)in_stack_ffffffffffffff58 >> 0x20));
            if (local_68 == (cjpeg_source_ptr)0x0) {
              pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
              snprintf(pcVar4,200,"%s","tjLoadImage(): Could not initialize bitmap loader");
              local_38 = -1;
              goto LAB_00180e8d;
            }
            bVar8 = (in_R9D & 2) == 0;
          }
          else {
            if (iVar1 != 0x50) {
              pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
              snprintf(pcVar4,200,"%s","tjLoadImage(): Unsupported file type");
              local_38 = -1;
              goto LAB_00180e8d;
            }
            local_68 = jinit_read_ppm(in_stack_ffffffffffffff60);
            if (local_68 == (cjpeg_source_ptr)0x0) {
              pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
              snprintf(pcVar4,200,"%s","tjLoadImage(): Could not initialize bitmap loader");
              local_38 = -1;
              goto LAB_00180e8d;
            }
            bVar8 = (in_R9D & 2) != 0;
          }
          local_68->input_file = (FILE *)local_78;
          (*local_68->start_input)(local_50,local_68);
          (*local_50->mem->realize_virt_arrays)((j_common_ptr)local_50);
          *in_RSI = local_50->image_width;
          *in_RCX = local_50->image_height;
          *in_R8 = cs2pf[local_50->in_color_space];
          lVar7 = (long)(int)((*in_RSI * tjPixelSize[*in_R8] + in_EDX) - 1 &
                             (in_EDX - 1 ^ 0xffffffff));
          local_70 = (uchar *)malloc(lVar7 * (int)*in_RCX);
          if (local_70 == (uchar *)0x0) {
            pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
            snprintf(pcVar4,200,"%s","tjLoadImage(): Memory allocation failure");
            local_38 = -1;
          }
          else {
            iVar1 = _setjmp((__jmp_buf_tag *)&local_50[2].restart_interval);
            if (iVar1 == 0) {
              while (local_50->next_scanline < local_50->image_height) {
                JVar3 = (*local_68->get_pixel_rows)(local_50,local_68);
                for (local_80 = 0; local_80 < (int)JVar3; local_80 = local_80 + 1) {
                  in_stack_ffffffffffffff6c = local_50->next_scanline + local_80;
                  iVar1 = in_stack_ffffffffffffff6c;
                  if (bVar8) {
                    iVar1 = (*in_RCX - in_stack_ffffffffffffff6c) + -1;
                  }
                  local_90 = local_70 + iVar1 * lVar7;
                  memcpy(local_90,local_68->buffer[local_80],
                         (long)(int)(*in_RSI * tjPixelSize[*in_R8]));
                }
                local_50->next_scanline = JVar3 + local_50->next_scanline;
              }
              (*local_68->finish_input)(local_50,local_68);
            }
            else {
              local_38 = -1;
            }
          }
        }
        else {
          local_38 = -1;
        }
      }
    }
  }
  else {
    pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(pcVar4,200,"%s","tjLoadImage(): Alignment must be a power of 2");
    local_38 = -1;
  }
LAB_00180e8d:
  if (local_50 != (j_compress_ptr)0x0) {
    tjDestroy((tjhandle)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  if (local_78 != (FILE *)0x0) {
    fclose(local_78);
  }
  if (local_38 < 0) {
    free(local_70);
    local_70 = (uchar *)0x0;
  }
  return local_70;
}

Assistant:

DLLEXPORT unsigned char *tjLoadImage(const char *filename, int *width,
                                     int align, int *height, int *pixelFormat,
                                     int flags)
{
  int retval = 0, tempc;
  size_t pitch;
  tjhandle handle = NULL;
  tjinstance *this;
  j_compress_ptr cinfo = NULL;
  cjpeg_source_ptr src;
  unsigned char *dstBuf = NULL;
  FILE *file = NULL;
  boolean invert;

  if (!filename || !width || align < 1 || !height || !pixelFormat ||
      *pixelFormat < TJPF_UNKNOWN || *pixelFormat >= TJ_NUMPF)
    THROWG("tjLoadImage(): Invalid argument");
  if ((align & (align - 1)) != 0)
    THROWG("tjLoadImage(): Alignment must be a power of 2");

  if ((handle = tjInitCompress()) == NULL) return NULL;
  this = (tjinstance *)handle;
  cinfo = &this->cinfo;

  if ((file = fopen(filename, "rb")) == NULL)
    THROW_UNIX("tjLoadImage(): Cannot open input file");

  if ((tempc = getc(file)) < 0 || ungetc(tempc, file) == EOF)
    THROW_UNIX("tjLoadImage(): Could not read input file")
  else if (tempc == EOF)
    THROWG("tjLoadImage(): Input file contains no data");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (*pixelFormat == TJPF_UNKNOWN) cinfo->in_color_space = JCS_UNKNOWN;
  else cinfo->in_color_space = pf2cs[*pixelFormat];
  if (tempc == 'B') {
    if ((src = jinit_read_bmp(cinfo, FALSE)) == NULL)
      THROWG("tjLoadImage(): Could not initialize bitmap loader");
    invert = (flags & TJFLAG_BOTTOMUP) == 0;
  } else if (tempc == 'P') {
    if ((src = jinit_read_ppm(cinfo)) == NULL)
      THROWG("tjLoadImage(): Could not initialize bitmap loader");
    invert = (flags & TJFLAG_BOTTOMUP) != 0;
  } else
    THROWG("tjLoadImage(): Unsupported file type");

  src->input_file = file;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  /* Refuse to load images larger than 1 Megapixel when fuzzing. */
  if (flags & TJFLAG_FUZZING)
    src->max_pixels = 1048576;
#endif
  (*src->start_input) (cinfo, src);
  (*cinfo->mem->realize_virt_arrays) ((j_common_ptr)cinfo);

  *width = cinfo->image_width;  *height = cinfo->image_height;
  *pixelFormat = cs2pf[cinfo->in_color_space];

  pitch = PAD((*width) * tjPixelSize[*pixelFormat], align);
  if ((unsigned long long)pitch * (unsigned long long)(*height) >
      (unsigned long long)((size_t)-1) ||
      (dstBuf = (unsigned char *)malloc(pitch * (*height))) == NULL)
    THROWG("tjLoadImage(): Memory allocation failure");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  while (cinfo->next_scanline < cinfo->image_height) {
    int i, nlines = (*src->get_pixel_rows) (cinfo, src);

    for (i = 0; i < nlines; i++) {
      unsigned char *dstptr;
      int row;

      row = cinfo->next_scanline + i;
      if (invert) dstptr = &dstBuf[((*height) - row - 1) * pitch];
      else dstptr = &dstBuf[row * pitch];
      memcpy(dstptr, src->buffer[i], (*width) * tjPixelSize[*pixelFormat]);
    }
    cinfo->next_scanline += nlines;
  }

  (*src->finish_input) (cinfo, src);

bailout:
  if (handle) tjDestroy(handle);
  if (file) fclose(file);
  if (retval < 0) { free(dstBuf);  dstBuf = NULL; }
  return dstBuf;
}